

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

void opengv::relative_pose::modules::ge::getQuickJacobian
               (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
               Matrix<double,_3,_9,_0,_3,_9> *x1P,Matrix<double,_3,_9,_0,_3,_9> *y1P,
               Matrix<double,_3,_9,_0,_3,_9> *z1P,Matrix<double,_3,_9,_0,_3,_9> *x2P,
               Matrix<double,_3,_9,_0,_3,_9> *y2P,Matrix<double,_3,_9,_0,_3,_9> *z2P,
               Matrix<double,_9,_9,_0,_9,_9> *m11P,Matrix<double,_9,_9,_0,_9,_9> *m12P,
               Matrix<double,_9,_9,_0,_9,_9> *m22P,cayley_t *cayley,double currentValue,
               Matrix<double,_1,_3,_1,_1,_3> *jacobian,int step)

{
  Scalar *pSVar1;
  Scalar *pSVar2;
  Matrix3d *in_RCX;
  Matrix3d *in_RDX;
  Matrix3d *in_RSI;
  Matrix3d *in_R8;
  Matrix3d *in_R9;
  Matrix3d *in_XMM0_Qa;
  double dVar3;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_00000008;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *in_stack_00000010;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000018;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000020;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000028;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000030;
  Matrix<double,_3,_9,_0,_3,_9> *in_stack_00000038;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00000040;
  Matrix<double,_9,_9,_0,_9,_9> *in_stack_00000048;
  undefined4 in_stack_00000060;
  double cost_j;
  cayley_t cayley_j;
  int j;
  double eps;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffee8;
  DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int local_74;
  double local_70;
  
  local_70 = 1e-08;
  for (local_74 = 0; local_74 < 3; local_74 = local_74 + 1) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8)
    ;
    dVar3 = local_70;
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffef0,(Index)in_stack_fffffffffffffee8);
    *pSVar1 = dVar3 + *pSVar1;
    in_stack_fffffffffffffee8 = in_stack_00000008;
    in_stack_fffffffffffffef0 = in_stack_00000010;
    dVar3 = getCost(in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_XMM0_Qa,
                    (Matrix<double,_3,_9,_0,_3,_9> *)in_stack_00000010,in_stack_00000018,
                    in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
                    in_stack_00000040,in_stack_00000048,
                    (Matrix<double,_9,_9,_0,_9,_9> *)&stack0xffffffffffffff70,
                    (cayley_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_00000060),
                    in_stack_ffffffffffffff40);
    dVar3 = dVar3 - (double)in_XMM0_Qa;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator()
                       (in_stack_fffffffffffffef0,(Index)in_stack_fffffffffffffee8,0x124ff79);
    *pSVar2 = dVar3;
  }
  return;
}

Assistant:

void
opengv::relative_pose::modules::ge::getQuickJacobian(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const Eigen::Matrix<double,3,9> & x1P,
    const Eigen::Matrix<double,3,9> & y1P,
    const Eigen::Matrix<double,3,9> & z1P,
    const Eigen::Matrix<double,3,9> & x2P,
    const Eigen::Matrix<double,3,9> & y2P,
    const Eigen::Matrix<double,3,9> & z2P,
    const Eigen::Matrix<double,9,9> & m11P,
    const Eigen::Matrix<double,9,9> & m12P,
    const Eigen::Matrix<double,9,9> & m22P,
    const cayley_t & cayley,
    double currentValue,
    Eigen::Matrix<double,1,3> & jacobian,
    int step )
{
  double eps = 0.00000001;
  
  for( int j = 0; j < 3; j++ )
  {
    cayley_t cayley_j = cayley; cayley_j[j] += eps;
    double cost_j = getCost(xxF,yyF,zzF,xyF,yzF,zxF,x1P,y1P,z1P,x2P,y2P,z2P,m11P,m12P,m22P,cayley_j,step);
    jacobian(0,j) = (cost_j - currentValue); //division by eps can be ommited
  }
}